

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInBinary * __thiscall
chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,double *Val)

{
  double tmp;
  
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,&tmp,8);
    StreamSwapBytes<double>(&tmp);
    *Val = tmp;
  }
  else {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,Val,8);
  }
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(double& Val) {
    if (big_endian_machine) {
        double tmp;
        this->Input((char*)&tmp, sizeof(double));
        StreamSwapBytes<double>(&tmp);
        Val = tmp;
    } else {
        this->Input((char*)&Val, sizeof(double));
    }
    return (*this);
}